

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

Vec_Ptr_t * Bac_PtrDeriveFromCba(Bac_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  
  if (p != (Bac_Man_t *)0x0) {
    if (p->pMioLib != (void *)0x0) {
      Bac_ManAssignInternWordNames(p);
      iVar7 = p->nNtks;
      if (iVar7 < -1) {
        __assert_fail("nCap >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
      }
      uVar1 = iVar7 + 1;
      uVar10 = (ulong)uVar1;
      pVVar3 = (Vec_Ptr_t *)malloc(0x10);
      pVVar3->nCap = uVar1;
      if (uVar1 == 0) {
        pcVar2 = p->pName;
        ppvVar4 = (void **)malloc(0x80);
        pVVar3->pArray = ppvVar4;
        pVVar3->nCap = 0x10;
        pVVar3->nSize = 1;
        *ppvVar4 = pcVar2;
      }
      else {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 3);
        pVVar3->pArray = ppvVar4;
        pcVar2 = p->pName;
        pVVar3->nSize = 1;
        *ppvVar4 = pcVar2;
        if (iVar7 == 0) {
          iVar7 = 1;
          iVar9 = 1;
        }
        else {
          lVar6 = 0xd0;
          lVar8 = 0;
          do {
            pVVar5 = Bac_NtkTransformToPtr((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar6));
            iVar7 = (int)uVar10;
            if ((int)lVar8 + 1 == iVar7) {
              if (iVar7 < 0x10) {
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
                }
                pVVar3->pArray = ppvVar4;
                pVVar3->nCap = 0x10;
                uVar10 = 0x10;
              }
              else {
                uVar10 = (ulong)(uint)(iVar7 * 2);
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(uVar10 * 8);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,uVar10 * 8);
                }
                pVVar3->pArray = ppvVar4;
                pVVar3->nCap = iVar7 * 2;
              }
            }
            else {
              ppvVar4 = pVVar3->pArray;
            }
            iVar9 = (int)uVar10;
            pVVar3->nSize = (int)lVar8 + 2;
            ppvVar4[lVar8 + 1] = pVVar5;
            lVar8 = lVar8 + 1;
            lVar6 = lVar6 + 0xd0;
          } while (lVar8 < p->nNtks);
          iVar7 = (int)lVar8 + 1;
        }
        if (iVar7 == iVar9) {
          return pVVar3;
        }
      }
      __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
    }
    puts("Cannot transform CBA network into Ptr because it is not mapped.");
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Bac_PtrDeriveFromCba( Bac_Man_t * p )
{
    Vec_Ptr_t * vDes;
    Bac_Ntk_t * pTemp; int i;
    if ( p == NULL )
        return NULL;
    if ( p->pMioLib == NULL )
    {
        printf( "Cannot transform CBA network into Ptr because it is not mapped.\n" );
        return NULL;
    }
    Bac_ManAssignInternWordNames( p );
    vDes = Vec_PtrAllocExact( 1 + Bac_ManNtkNum(p) );
    Vec_PtrPush( vDes, p->pName );
    Bac_ManForEachNtk( p, pTemp, i )
        Vec_PtrPush( vDes, Bac_NtkTransformToPtr(pTemp) );
    assert( Ptr_CheckArray(vDes) );
    return vDes;
}